

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int parseHhMmSs(char *zDate,DateTime *p)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *zDate_00;
  bool bVar7;
  double dVar8;
  double dVar9;
  int s;
  int m;
  int h;
  int nMn;
  int nHr;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  iVar3 = getDigits(zDate,"20c:20e",&local_2c,&local_30);
  if (iVar3 != 2) {
    return 1;
  }
  if (zDate[5] == ':') {
    iVar3 = getDigits(zDate + 6,"20e",&local_34);
    if (iVar3 != 1) {
      return 1;
    }
    zDate_00 = (byte *)(zDate + 8);
    dVar8 = 0.0;
    if ((zDate[8] == '.') && (0xfffffffffffffff5 < (ulong)(byte)zDate[9] - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      uVar5 = (ulong)*zDate_00;
      if (0xfffffffffffffff5 < uVar5 - 0x3a) {
        dVar9 = 1.0;
        do {
          dVar8 = dVar8 * 10.0 + (double)(int)(char)uVar5 + -48.0;
          dVar9 = dVar9 * 10.0;
          uVar5 = (ulong)zDate_00[1];
          zDate_00 = zDate_00 + 1;
        } while (0xfffffffffffffff5 < uVar5 - 0x3a);
        dVar8 = dVar8 / dVar9;
      }
    }
  }
  else {
    zDate_00 = (byte *)(zDate + 5);
    local_34 = 0;
    dVar8 = 0.0;
  }
  p->validJD = '\0';
  bVar1 = p->field_0x2c;
  p->field_0x2c = bVar1 & 0xfe;
  p->validHMS = '\x01';
  p->h = local_2c;
  p->m = local_30;
  p->s = (double)local_34 + dVar8;
  do {
    pbVar6 = zDate_00;
    zDate_00 = pbVar6 + 1;
  } while ((""[*pbVar6] & 1) != 0);
  p->tz = 0;
  bVar2 = *pbVar6;
  if (bVar2 == 0x2d) {
    iVar3 = -1;
LAB_001a6cb3:
    iVar4 = getDigits((char *)zDate_00,"20b:20e",&local_24,&local_28);
    bVar7 = true;
    if (iVar4 != 2) goto LAB_001a6d13;
    zDate_00 = pbVar6 + 6;
    p->tz = (local_24 * 0x3c + local_28) * iVar3;
LAB_001a6cfd:
    do {
      bVar2 = *zDate_00;
      zDate_00 = zDate_00 + 1;
    } while ((""[bVar2] & 1) != 0);
  }
  else {
    if (bVar2 == 0x2b) {
      iVar3 = 1;
      goto LAB_001a6cb3;
    }
    if ((bVar2 & 0xdf) == 0x5a) {
      p->field_0x2c = bVar1 & 0xe6 | 8;
      goto LAB_001a6cfd;
    }
  }
  bVar7 = bVar2 != 0;
LAB_001a6d13:
  return (uint)bVar7;
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  return 0;
}